

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O3

uint RDL_addUEdge_g(RDL_graph *gra,uint from,uint to)

{
  RDL_edge **ppaRVar1;
  ulong uVar2;
  uint *puVar3;
  uint **ppuVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar2 = (ulong)from;
  if (from < gra->V && to < gra->V) {
    if (from != to) {
      if ((ulong)gra->degree[uVar2] != 0) {
        uVar5 = 0;
        do {
          if (gra->adjList[uVar2][uVar5][0] == to) {
            puVar3 = &RDL_DUPLICATE_EDGE;
            goto LAB_00107967;
          }
          uVar5 = uVar5 + 1;
        } while (gra->degree[uVar2] != uVar5);
      }
      RDL_addEdge(gra,from,to);
      RDL_addEdge(gra,to,from);
      uVar7 = gra->E - 1;
      gra->E = uVar7;
      if (uVar7 == gra->edgesAlloced) {
        gra->edgesAlloced = uVar7 * 2;
        ppuVar4 = (uint **)realloc(gra->edges,(ulong)(uVar7 * 2) << 3);
        gra->edges = ppuVar4;
        uVar7 = gra->E;
      }
      else {
        ppuVar4 = gra->edges;
      }
      uVar6 = to;
      if (from < to) {
        uVar6 = from;
      }
      if (from <= to) {
        from = to;
      }
      puVar3 = (uint *)malloc(8);
      ppuVar4[uVar7 - 1] = puVar3;
      ppuVar4 = gra->edges;
      *ppuVar4[uVar7 - 1] = uVar6;
      ppuVar4[gra->E - 1][1] = from;
      uVar7 = gra->E - 1;
      ppaRVar1 = gra->adjList;
      puVar3 = gra->degree;
      ppaRVar1[uVar2][puVar3[uVar2] - 1][1] = uVar7;
      ppaRVar1[to][puVar3[to] - 1][1] = uVar7;
      return uVar7;
    }
    (*RDL_outputFunc)(RDL_WARNING,"Adding a loop is not allowed, node %u\n",uVar2);
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"Tried to add an edge with atoms not in range.\n");
    (*RDL_outputFunc)(RDL_ERROR,"edge (%u,%u) can not be added to graph with %u atoms.\n",uVar2,
                      (ulong)to,(ulong)gra->V);
  }
  puVar3 = &RDL_INVALID_RESULT;
LAB_00107967:
  return *puVar3;
}

Assistant:

unsigned RDL_addUEdge_g(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned edge_id, i;

  if(from >= gra->V || to >= gra->V) {
    RDL_outputFunc(RDL_ERROR, "Tried to add an edge with atoms not in range.\n");
    RDL_outputFunc(RDL_ERROR,  "edge (%u,%u) can not be added to graph with %u atoms.\n",
        from, to, gra->V);
    return RDL_INVALID_RESULT;
  }

  if (from == to) {
    RDL_outputFunc(RDL_WARNING, "Adding a loop is not allowed, node %u\n", from);
    return RDL_INVALID_RESULT;
  }

  for(i=0; i<gra->degree[from]; ++i) {
    if(gra->adjList[from][i][0] == to) {
      /*edge already exists*/
      return RDL_DUPLICATE_EDGE;
    }
  }
  RDL_addEdge(gra, from, to);
  RDL_addEdge(gra, to, from);
  --gra->E; /*was incremented twice*/

  edge_id = RDL_addToEdgeArray(gra, from, to);

  gra->adjList[from][gra->degree[from]-1][1] = edge_id;
  gra->adjList[to][gra->degree[to]-1][1] = edge_id;

  return edge_id;
}